

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

int mbedtls_ssl_conf_dh_param(mbedtls_ssl_config *conf,char *dhm_P,char *dhm_G)

{
  int local_2c;
  int ret;
  char *dhm_G_local;
  char *dhm_P_local;
  mbedtls_ssl_config *conf_local;
  
  local_2c = mbedtls_mpi_read_string(&conf->dhm_P,0x10,dhm_P);
  if ((local_2c == 0) &&
     (local_2c = mbedtls_mpi_read_string(&conf->dhm_G,0x10,dhm_G), local_2c == 0)) {
    return 0;
  }
  mbedtls_mpi_free(&conf->dhm_P);
  mbedtls_mpi_free(&conf->dhm_G);
  return local_2c;
}

Assistant:

int mbedtls_ssl_conf_dh_param( mbedtls_ssl_config *conf, const char *dhm_P, const char *dhm_G )
{
    int ret;

    if( ( ret = mbedtls_mpi_read_string( &conf->dhm_P, 16, dhm_P ) ) != 0 ||
        ( ret = mbedtls_mpi_read_string( &conf->dhm_G, 16, dhm_G ) ) != 0 )
    {
        mbedtls_mpi_free( &conf->dhm_P );
        mbedtls_mpi_free( &conf->dhm_G );
        return( ret );
    }

    return( 0 );
}